

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlCatalogRemove(xmlChar *value)

{
  int iVar1;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  xmlRMutexLock(xmlCatalogMutex);
  iVar1 = xmlACatalogRemove(xmlDefaultCatalog,value);
  xmlRMutexUnlock(xmlCatalogMutex);
  return iVar1;
}

Assistant:

int
xmlCatalogRemove(const xmlChar *value) {
    int res;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    xmlRMutexLock(xmlCatalogMutex);
    res = xmlACatalogRemove(xmlDefaultCatalog, value);
    xmlRMutexUnlock(xmlCatalogMutex);
    return(res);
}